

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Label.cxx
# Opt level: O0

void multi_labeltype(Fl_Label *o,int x,int y,int w,int h,Fl_Align a)

{
  int local_68;
  int d;
  int H;
  int W;
  Fl_Label local;
  Fl_Multi_Label *b;
  int local_20;
  Fl_Align a_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Label *o_local;
  
  local._40_8_ = o->value;
  memcpy(&H,o,0x30);
  _H = *(char **)local._40_8_;
  local.color._0_1_ = *(undefined1 *)(local._40_8_ + 0x10);
  local_68 = h;
  d = w;
  Fl_Label::measure((Fl_Label *)&H,&d,&local_68);
  Fl_Label::draw((Fl_Label *)&H,x,y,w,h,a);
  a_local = w;
  h_local = y;
  w_local = x;
  if ((a & 2) == 0) {
    if ((a & 1) == 0) {
      local_20 = h;
      if ((a & 8) == 0) {
        if ((a & 4) == 0) {
          local_20 = (h + local_68) / 2;
          h_local = local_20 + y;
          local_20 = h - local_20;
        }
        else {
          w_local = d + x;
          a_local = w - d;
        }
      }
      else {
        a_local = w - d;
      }
    }
    else {
      h_local = local_68 + y;
      local_20 = h - local_68;
    }
  }
  else {
    local_20 = h - local_68;
  }
  _H = *(char **)(local._40_8_ + 8);
  local.color._0_1_ = *(undefined1 *)(local._40_8_ + 0x11);
  Fl_Label::draw((Fl_Label *)&H,w_local,h_local,a_local,local_20,a);
  return;
}

Assistant:

static void multi_labeltype(
    const Fl_Label* o, int x, int y, int w, int h, Fl_Align a)
{
  Fl_Multi_Label* b = (Fl_Multi_Label*)(o->value);
  Fl_Label local = *o;
  local.value = b->labela;
  local.type = b->typea;
  int W = w; int H = h; local.measure(W, H);
  local.draw(x,y,w,h,a);
  if (a & FL_ALIGN_BOTTOM) h -= H;
  else if (a & FL_ALIGN_TOP) {y += H; h -= H;}
  else if (a & FL_ALIGN_RIGHT) w -= W;
  else if (a & FL_ALIGN_LEFT) {x += W; w -= W;}
  else {int d = (h+H)/2; y += d; h -= d;}
  local.value = b->labelb;
  local.type = b->typeb;
  local.draw(x,y,w,h,a);
}